

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

parser_error parse_class_book_graphics(parser *p)

{
  wchar_t wVar1;
  long lVar2;
  uint8_t uVar3;
  wchar_t wVar4;
  parser_error pVar6;
  void *pvVar7;
  char *__s;
  object_kind *poVar8;
  size_t sVar9;
  long lVar10;
  int iVar5;
  
  pvVar7 = parser_priv(p);
  wVar4 = parser_getchar(p,"glyph");
  __s = parser_getsym(p,"color");
  pVar6 = PARSE_ERROR_MISSING_RECORD_HEADER;
  if (pvVar7 != (void *)0x0) {
    wVar1 = *(wchar_t *)((long)pvVar7 + 0xf8);
    if (0 < (long)wVar1) {
      lVar2 = *(long *)((long)pvVar7 + 0x100);
      if ((lVar2 == 0) || (class_max_books < wVar1)) {
        __assert_fail("c->magic.books && c->magic.num_books <= class_max_books",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/init.c"
                      ,0xe9d,"enum parser_error parse_class_book_graphics(struct parser *)");
      }
      lVar10 = (long)wVar1 * 0x20;
      poVar8 = lookup_kind(*(wchar_t *)(lVar2 + -0x20 + lVar10),*(wchar_t *)(lVar2 + -0x1c + lVar10)
                          );
      if (poVar8 == (object_kind *)0x0) {
        __assert_fail("k",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/init.c"
                      ,0xea0,"enum parser_error parse_class_book_graphics(struct parser *)");
      }
      poVar8->d_char = wVar4;
      sVar9 = strlen(__s);
      if (sVar9 < 2) {
        iVar5 = color_char_to_attr(*__s);
        uVar3 = (uint8_t)iVar5;
      }
      else {
        iVar5 = color_text_to_attr(__s);
        uVar3 = (uint8_t)iVar5;
      }
      poVar8->d_attr = uVar3;
      pVar6 = PARSE_ERROR_NONE;
    }
  }
  return pVar6;
}

Assistant:

static enum parser_error parse_class_book_graphics(struct parser *p) {
	struct player_class *c = parser_priv(p);
	wchar_t glyph = parser_getchar(p, "glyph");
	const char *color = parser_getsym(p, "color");
	struct class_book *b;
	struct object_kind *k;

	if (!c) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	if (c->magic.num_books < 1) {
		/*
		 * Either missing a magic directive for the class or didn't
		 * have a book directive after the magic directive.
		 */
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	assert(c->magic.books && c->magic.num_books <= class_max_books);
	b = &c->magic.books[c->magic.num_books - 1];
	k = lookup_kind(b->tval, b->sval);
	assert(k);
	k->d_char = glyph;
	if (strlen(color) > 1) {
		k->d_attr = color_text_to_attr(color);
	} else {
		k->d_attr = color_char_to_attr(color[0]);
	}

	return PARSE_ERROR_NONE;
}